

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O0

double __thiscall iDynTree::SpatialMotionVector::exp(SpatialMotionVector *this,double __x)

{
  Transform *in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  Matrix3x3 J_SO3;
  Position newPos;
  Transform *res;
  AngularMotionVector3 *in_stack_000002d0;
  DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffed8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  
  Transform::Transform(in_RSI);
  Position::Position((Position *)0x6f1303);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialMotionVector> *)in_RSI);
  Rotation::leftJacobian(in_stack_000002d0);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffef8);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialMotionVector> *)in_RSI);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffef8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffef8,
             (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)this);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffef8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
             in_stack_fffffffffffffed8);
  Transform::setPosition(in_RSI,(Position *)in_stack_fffffffffffffed8);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialMotionVector> *)in_RSI);
  GeomVector3::exp((GeomVector3 *)&stack0xfffffffffffffef8,__x_00);
  Transform::setRotation(in_RSI,(Rotation *)in_stack_fffffffffffffed8);
  return extraout_XMM0_Qa;
}

Assistant:

Transform SpatialMotionVector::exp() const
{
    Transform res;

    // the linear part is affected by the left Jacobian of SO(3)
    Position newPos;
    auto J_SO3 = Rotation::leftJacobian(this->getAngularVec3());
    toEigen(newPos) = toEigen(J_SO3)*toEigen(this->getLinearVec3());
    res.setPosition(newPos);

    // the angular part instead mapped by so(3) -> SO(3) exp map
    res.setRotation(this->getAngularVec3().exp());

    return res;
}